

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall
Reset_resetFromComponentMethod_Test::~Reset_resetFromComponentMethod_Test
          (Reset_resetFromComponentMethod_Test *this)

{
  Reset_resetFromComponentMethod_Test *this_local;
  
  ~Reset_resetFromComponentMethod_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, resetFromComponentMethod)
{
    const std::string in = "valid_name";
    libcellml::ComponentPtr c = libcellml::Component::create();
    c->setName(in);

    libcellml::ResetPtr r1 = libcellml::Reset::create();
    c->addReset(r1);
    libcellml::ResetPtr r2 = libcellml::Reset::create();
    c->addReset(r2);
    libcellml::ResetPtr r3 = libcellml::Reset::create();
    c->addReset(r3);
    libcellml::ResetPtr r4 = libcellml::Reset::create();
    c->addReset(r4);

    EXPECT_EQ(size_t(4), c->resetCount());

    // Get by index.
    libcellml::ResetPtr rMethod1 = c->reset(1);
    EXPECT_EQ(r2.get(), rMethod1.get());

    // Get const by index.
    const libcellml::ResetPtr vMethod2 = c->reset(3);
    EXPECT_EQ(r4.get(), vMethod2.get());

    // Get invalid index.
    EXPECT_EQ(nullptr, c->reset(7));
}